

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O3

bool __thiscall lzham::symbol_codec::arith_renorm_enc_interval(symbol_codec *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = (this->m_arith_output_buf).m_size;
  uVar3 = this->m_arith_base;
  do {
    if ((this->m_arith_output_buf).m_capacity <= uVar4) {
      bVar1 = elemental_vector::increase_capacity
                        ((elemental_vector *)&this->m_arith_output_buf,uVar4 + 1,true,1,
                         (object_mover)0x0,true);
      if (!bVar1) {
        return false;
      }
      uVar4 = (this->m_arith_output_buf).m_size;
    }
    (this->m_arith_output_buf).m_p[uVar4] = (uchar)(uVar3 >> 0x18);
    uVar3 = this->m_arith_base;
    uVar4 = (this->m_arith_output_buf).m_size + 1;
    (this->m_arith_output_buf).m_size = uVar4;
    this->m_total_bits_written = this->m_total_bits_written + 8;
    uVar3 = uVar3 << 8;
    this->m_arith_base = uVar3;
    uVar2 = this->m_arith_length << 8;
    this->m_arith_length = uVar2;
  } while (uVar2 < 0x1000000);
  return true;
}

Assistant:

bool symbol_codec::arith_renorm_enc_interval()
   {
      do
      {
         if (!m_arith_output_buf.try_push_back( (m_arith_base >> 24) & 0xFF ))
            return false;
         m_total_bits_written += 8;

         m_arith_base <<= 8;
      } while ((m_arith_length <<= 8) < cSymbolCodecArithMinLen);
      return true;
   }